

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Array<kj::_::KeyMaybeVal> *
kj::_::toKeysAndVals
          (Array<kj::_::KeyMaybeVal> *__return_storage_ptr__,
          ArrayPtr<kj::ArrayPtr<const_char>_> *params)

{
  long *plVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  ArrayPtr<const_char> *param;
  ArrayPtr<const_char> *c;
  long lVar5;
  ArrayPtr<const_char> local_88;
  Array<kj::_::KeyMaybeVal> result;
  ArrayPtr<const_char> local_58;
  Maybe<kj::ArrayPtr<const_char>_> local_48;
  
  sVar2 = params->size_;
  result.ptr = HeapArrayDisposer::allocate<kj::_::KeyMaybeVal>(sVar2);
  result.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  c = params->ptr;
  lVar4 = 0x10;
  result.size_ = sVar2;
  for (lVar5 = params->size_ << 4; lVar5 != 0; lVar5 = lVar5 + -0x10) {
    local_48.ptr.isSet = false;
    ArrayPtr<const_char>::findFirst(&local_58,(char *)c);
    sVar2 = local_58.size_;
    if ((char)local_58.ptr == '\x01') {
      pcVar3 = c->ptr;
      local_88.size_ = local_58.size_;
      local_88.ptr = pcVar3;
      stripLeadingAndTrailingSpace(&local_88);
      local_48.ptr.field_1.value.size_ = c->size_ - (sVar2 + 1);
      local_48.ptr.field_1.value.ptr = pcVar3 + sVar2 + 1;
      local_48.ptr.isSet = true;
      stripLeadingAndTrailingSpace(&local_48.ptr.field_1.value);
    }
    else {
      local_88.ptr = c->ptr;
      local_88.size_ = c->size_;
    }
    plVar1 = (long *)((long)result.ptr + lVar4 + -0x10);
    *plVar1 = (long)local_88.ptr;
    plVar1[1] = local_88.size_;
    Maybe<kj::ArrayPtr<const_char>_>::operator=
              ((Maybe<kj::ArrayPtr<const_char>_> *)((long)&((result.ptr)->key).ptr + lVar4),
               &local_48);
    c = c + 1;
    lVar4 = lVar4 + 0x28;
  }
  __return_storage_ptr__->ptr = result.ptr;
  __return_storage_ptr__->size_ = result.size_;
  __return_storage_ptr__->disposer = result.disposer;
  result.ptr = (KeyMaybeVal *)0x0;
  result.size_ = 0;
  Array<kj::_::KeyMaybeVal>::~Array(&result);
  return __return_storage_ptr__;
}

Assistant:

kj::Array<KeyMaybeVal> toKeysAndVals(const kj::ArrayPtr<kj::ArrayPtr<const char>>& params) {
  // Given a collection of parameters (a single offer), parse the parameters into <key, MaybeValue>
  // pairs. If the parameter contains an `=`, we set the `key` to everything before, and the `value`
  // to everything after. Otherwise, we set the `key` to be the entire parameter.
  // Either way, both the key and value (if it exists) are stripped of leading & trailing whitespace.
  auto result = kj::heapArray<KeyMaybeVal>(params.size());
  size_t count = 0;
  for (const auto& param : params) {
    kj::ArrayPtr<const char> key;
    kj::Maybe<kj::ArrayPtr<const char>> value;

    KJ_IF_SOME(index, param.findFirst('=')) {
      // Found '=' so we have a value.
      key = param.first(index);
      stripLeadingAndTrailingSpace(key);
      value = param.slice(index + 1, param.size());
      KJ_IF_SOME(v, value) {
        stripLeadingAndTrailingSpace(v);
      }
    } else {
      key = kj::mv(param);
    }

    result[count].key = kj::mv(key);
    result[count].val = kj::mv(value);
    ++count;
  }